

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O3

void __thiscall wallet::SQLiteCursor::~SQLiteCursor(SQLiteCursor *this)

{
  pointer pbVar1;
  int iVar2;
  char (*args) [14];
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  char **args_1;
  
  args_1 = *(char ***)(in_FS_OFFSET + 0x28);
  (this->super_DatabaseCursor)._vptr_DatabaseCursor = (_func_int **)&PTR__SQLiteCursor_013bbbb0;
  sqlite3_clear_bindings(this->m_cursor_stmt);
  sqlite3_reset(this->m_cursor_stmt);
  iVar2 = sqlite3_finalize(this->m_cursor_stmt);
  if (iVar2 != 0) {
    args = (char (*) [14])sqlite3_errstr(iVar2);
    logging_function._M_str = "~SQLiteCursor";
    logging_function._M_len = 0xd;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
    ;
    source_file._M_len = 0x5a;
    LogPrintf_<char[14],char_const*>
              (logging_function,source_file,0x24e,0x111488e,0x1114880,&stack0xffffffffffffffe8,args,
               args_1);
  }
  pbVar1 = (this->m_prefix_range_end).super__Vector_base<std::byte,_std::allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pbVar1 != (pointer)0x0) {
    operator_delete(pbVar1,(long)(this->m_prefix_range_end).
                                 super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pbVar1);
  }
  pbVar1 = (this->m_prefix_range_start).super__Vector_base<std::byte,_std::allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pbVar1 != (pointer)0x0) {
    operator_delete(pbVar1,(long)(this->m_prefix_range_start).
                                 super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pbVar1);
  }
  if (*(char ***)(in_FS_OFFSET + 0x28) == args_1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLiteCursor::~SQLiteCursor()
{
    sqlite3_clear_bindings(m_cursor_stmt);
    sqlite3_reset(m_cursor_stmt);
    int res = sqlite3_finalize(m_cursor_stmt);
    if (res != SQLITE_OK) {
        LogPrintf("%s: cursor closed but could not finalize cursor statement: %s\n",
                  __func__, sqlite3_errstr(res));
    }
}